

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpAgent.cpp
# Opt level: O3

int __thiscall
HttpAgent::sendAndGet
          (HttpAgent *this,HttpRequest *req,HttpResponse *res,string *toSend,BodyHandler *handler)

{
  Socket *this_00;
  IReaderWriter *reader;
  _func_int **pp_Var1;
  int iVar2;
  uint uVar3;
  ErrCode EVar4;
  int iVar5;
  ssize_t sVar6;
  undefined4 extraout_var;
  char *pcVar7;
  uint8_t *puVar8;
  string *__n;
  size_t sVar9;
  void *__buf;
  bool bVar10;
  BodyHandler *pBVar11;
  int buffer_len;
  int length;
  Address addr;
  URI uri;
  uint local_16c;
  undefined8 local_168;
  BodyHandler *local_160;
  string local_158;
  Address local_134;
  URI local_110;
  
  __n = toSend;
  local_160 = handler;
  URI::URI(&local_110,&req->mUri);
  iVar5 = (int)handler;
  URI::getHost_abi_cxx11_(&local_158,&local_110);
  pcVar7 = (char *)CONCAT44(local_158._M_dataplus._M_p._4_4_,(uint)local_158._M_dataplus._M_p);
  iVar2 = URI::getPort(&local_110);
  local_134.mAddr.sin_family = 2;
  local_134.mAddr.sin_port = (ushort)iVar2 << 8 | (ushort)iVar2 >> 8;
  JetHead::Socket::Address::setAddress(&local_134,pcVar7);
  local_134.mLen = 0x10;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_158._M_dataplus._M_p._4_4_,(uint)local_158._M_dataplus._M_p) !=
      &local_158.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_158._M_dataplus._M_p._4_4_,(uint)local_158._M_dataplus._M_p),
                    local_158.field_2._M_allocated_capacity + 1);
  }
  this_00 = &this->mSock;
  (this->mSock).mReadTimeout = 5;
  iVar2 = JetHead::Socket::connect(this_00,(int)&local_134,(sockaddr *)0xa,(socklen_t)__n);
  if (iVar2 == 0) {
    reader = &(this->mSock).super_IReaderWriter;
    HttpHeaderBase::send((HttpHeaderBase *)req,(int)reader,__buf,(size_t)__n,iVar5);
    if ((void *)toSend->_M_string_length != (void *)0x0) {
      sVar6 = JetHead::Socket::write
                        (this_00,(int)(toSend->_M_dataplus)._M_p,(void *)toSend->_M_string_length,
                         (size_t)__n);
      iVar2 = 0xe;
      if ((int)sVar6 != (int)toSend->_M_string_length) goto LAB_001183ba;
    }
    JetHead::CircularBuffer::clear(&this->mBuffer);
    bVar10 = true;
    do {
      iVar2 = JetHead::CircularBuffer::getFreeSpace(&this->mBuffer);
      iVar2 = JetHead::CircularBuffer::fillFromFile(&this->mBuffer,reader,iVar2);
      if (iVar2 < 1) goto LAB_001183b5;
      while (iVar2 = HttpHeaderBase::searchForLine(&this->mBuffer), 0 < iVar2) {
        pp_Var1 = (res->super_HttpHeader).super_HttpHeaderBase._vptr_HttpHeaderBase;
        if (bVar10) {
          uVar3 = (*pp_Var1[2])(res);
        }
        else {
          uVar3 = (*pp_Var1[3])(res);
        }
        bVar10 = false;
        if (-1 < (int)uVar3) {
          bVar10 = false;
          JetHead::CircularBuffer::read(&this->mBuffer,0,(void *)(ulong)uVar3,(size_t)__n);
        }
      }
      iVar2 = HttpHeaderBase::searchForLine(&this->mBuffer);
    } while ((iVar2 != 0) || (iVar2 = JetHead::CircularBuffer::getLength(&this->mBuffer), iVar2 < 2)
            );
    iVar5 = res->mResponseCode;
    JetHead::CircularBuffer::read(&this->mBuffer,0,(void *)0x2,(size_t)__n);
    local_158._M_dataplus._M_p._0_4_ = 0;
    EVar4 = HttpHeaderBase::getFieldInt((HttpHeaderBase *)res,0x3f4,(int32_t *)&local_158);
    pBVar11 = local_160;
    local_168 = CONCAT44(extraout_var,EVar4);
    if (EVar4 == kNoError) {
      if (0 < (int)(uint)local_158._M_dataplus._M_p) {
        JetHead::CircularBuffer::getBytes(&this->mBuffer,0,(int *)&local_16c);
        sVar9 = (size_t)(uint)local_158._M_dataplus._M_p;
        if ((int)(uint)local_158._M_dataplus._M_p < (int)local_16c) {
          local_16c = (uint)local_158._M_dataplus._M_p;
        }
        if (local_160 != (BodyHandler *)0x0) {
          sVar9 = *(size_t *)local_160;
          (**(code **)(sVar9 + 0x10))();
        }
        JetHead::CircularBuffer::read(&this->mBuffer,0,(void *)(ulong)local_16c,sVar9);
        pBVar11 = local_160;
        local_158._M_dataplus._M_p._0_4_ = (uint)local_158._M_dataplus._M_p - local_16c;
        if ((uint)local_158._M_dataplus._M_p != 0) {
          iVar5 = (**(code **)(*(size_t *)local_160 + 0x18))(local_160,this_00);
          if (iVar5 < 0) {
LAB_001183b5:
            iVar2 = 0xd;
            goto LAB_001183ba;
          }
          local_158._M_dataplus._M_p._0_4_ = 0;
        }
      }
      local_168 = 0;
    }
    else {
      pcVar7 = HttpHeaderBase::getField((HttpHeaderBase *)res,0x410);
      if ((pcVar7 != (char *)0x0) && (iVar2 = strcmp(pcVar7,"chunked"), iVar2 == 0)) {
        while (uVar3 = parseChunkLine(&this->mBuffer,(int *)&local_158), (int)uVar3 < 1) {
          iVar2 = JetHead::CircularBuffer::getFreeSpace(&this->mBuffer);
          iVar5 = JetHead::CircularBuffer::fillFromFile(&this->mBuffer,reader,iVar2);
          if (iVar5 < 0) {
            iVar2 = 0xd;
            jh_log_print(0,
                         "int HttpAgent::sendAndGet(HttpRequest &, HttpResponse &, const std::string &, BodyHandler *)"
                         ,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/HttpAgent.cpp"
                         ,0xd7,"Socket read failed...");
            goto LAB_001183ba;
          }
          iVar2 = JetHead::CircularBuffer::byteAt(&this->mBuffer,0);
          if (iVar2 == 0xd) {
            JetHead::CircularBuffer::read(&this->mBuffer,0,(void *)0x1,(size_t)__n);
          }
          iVar2 = JetHead::CircularBuffer::byteAt(&this->mBuffer,0);
          if (iVar2 == 10) {
            JetHead::CircularBuffer::read(&this->mBuffer,0,(void *)0x1,(size_t)__n);
          }
        }
        local_168 = 0;
        JetHead::CircularBuffer::read(&this->mBuffer,0,(void *)(ulong)uVar3,(size_t)__n);
        if (0 < (int)(uint)local_158._M_dataplus._M_p) {
          do {
            puVar8 = JetHead::CircularBuffer::getBytes(&this->mBuffer,0,(int *)&local_16c);
            if ((int)(uint)local_158._M_dataplus._M_p < (int)local_16c) {
              local_16c = (uint)local_158._M_dataplus._M_p;
            }
            sVar9 = (size_t)local_16c;
            if (local_16c != 0 && pBVar11 != (BodyHandler *)0x0) {
              (**(code **)(*(size_t *)pBVar11 + 0x10))(pBVar11,puVar8,sVar9);
              JetHead::CircularBuffer::read(&this->mBuffer,0,(void *)(ulong)local_16c,sVar9);
              local_158._M_dataplus._M_p._0_4_ = (uint)local_158._M_dataplus._M_p - local_16c;
            }
            if ((uint)local_158._M_dataplus._M_p != 0) {
              iVar5 = (**(code **)(*(size_t *)pBVar11 + 0x18))(pBVar11,this_00);
              if (iVar5 < 1) {
                iVar2 = 0xd;
                if (iVar5 == 0) {
                  iVar2 = 0;
                }
                goto LAB_001183ba;
              }
              local_158._M_dataplus._M_p._0_4_ = 0;
            }
            iVar2 = JetHead::CircularBuffer::getFreeSpace(&this->mBuffer);
            iVar5 = JetHead::CircularBuffer::fillFromFile(&this->mBuffer,reader,iVar2);
            if (iVar5 < 0) {
              iVar5 = 0x10c;
LAB_00118593:
              iVar2 = 0xd;
              jh_log_print(0,
                           "int HttpAgent::sendAndGet(HttpRequest &, HttpResponse &, const std::string &, BodyHandler *)"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/HttpAgent.cpp"
                           ,iVar5,"Socket read failed...");
              goto LAB_001183ba;
            }
            iVar2 = JetHead::CircularBuffer::byteAt(&this->mBuffer,0);
            if (iVar2 == 0xd) {
              JetHead::CircularBuffer::read(&this->mBuffer,0,(void *)0x1,sVar9);
            }
            iVar2 = JetHead::CircularBuffer::byteAt(&this->mBuffer,0);
            if (iVar2 == 10) {
              JetHead::CircularBuffer::read(&this->mBuffer,0,(void *)0x1,sVar9);
            }
            while (uVar3 = parseChunkLine(&this->mBuffer,(int *)&local_158), (int)uVar3 < 1) {
              iVar2 = JetHead::CircularBuffer::getFreeSpace(&this->mBuffer);
              iVar5 = JetHead::CircularBuffer::fillFromFile(&this->mBuffer,reader,iVar2);
              if (iVar5 < 0) {
                iVar5 = 0x11a;
                goto LAB_00118593;
              }
              iVar2 = JetHead::CircularBuffer::byteAt(&this->mBuffer,0);
              if (iVar2 == 0xd) {
                JetHead::CircularBuffer::read(&this->mBuffer,0,(void *)0x1,sVar9);
              }
              iVar2 = JetHead::CircularBuffer::byteAt(&this->mBuffer,0);
              if (iVar2 == 10) {
                JetHead::CircularBuffer::read(&this->mBuffer,0,(void *)0x1,sVar9);
              }
            }
            JetHead::CircularBuffer::read(&this->mBuffer,0,(void *)(ulong)uVar3,sVar9);
            local_168 = 0;
          } while (0 < (int)(uint)local_158._M_dataplus._M_p);
        }
      }
    }
    if (pBVar11 != (BodyHandler *)0x0) {
      (**(code **)(*(size_t *)pBVar11 + 0x20))(pBVar11,1);
    }
    if ((iVar5 == 0xce) || (iVar2 = 1, iVar5 == 200)) {
      iVar2 = (int)local_168;
    }
  }
  else {
    res->mResponseCode = -1;
    iVar2 = 2;
  }
LAB_001183ba:
  URI::~URI(&local_110);
  return iVar2;
}

Assistant:

int HttpAgent::sendAndGet( HttpRequest &req, HttpResponse &res, 
						   const std::string& toSend, BodyHandler* handler )
{
	URI uri = req.getURI();

	Socket::Address addr( uri.getHost().c_str(), uri.getPort() );
	bool first_line = true;
	int len;
	int ret;
	ErrCode err = kNoError;

	mSock.setReadTimeout( 5 );
	ret = mSock.connect( addr, 10 );

	if (ret != 0)
	{
		LOG_NOTICE("Socket connect failed...");
		res.setResponseCode(-1);
		return kConnectionFailed;
	}

	ret = req.send( &mSock );
	if (not toSend.empty())
	{
		if (mSock.write(toSend.c_str(), toSend.size()) != (int)toSend.size())
		{
			return kWriteFailed;
		}
	}

	mBuffer.clear();
	do
	{
		ret = mBuffer.fillFromFile(&mSock, mBuffer.getFreeSpace());

		if (ret <= 0)
		{
			LOG_NOTICE("Socket read failed...");
			return kReadFailed;
		}

		while (HttpHeaderBase::searchForLine(mBuffer) > 0)
		{
			if (first_line)
			{
				len = res.parseFirstLine(mBuffer);
				first_line = false;
			}
			else
			{
				len = res.parseLine(mBuffer);
			}

			if (len < 0)
			{
				LOG_NOTICE("Problem parsing response...");
			}
			else
			{
				mBuffer.read(NULL, len);
			}
		}
		
	} while (HttpHeaderBase::searchForLine(mBuffer) != HttpHeaderBase::kEOH or
			 mBuffer.getLength() < 2);

	ret = res.getResponseCode();

	// read \r\n from buffer
	mBuffer.read( NULL, 2 );			
	
	// Get Body of Response.

	int read_len, length = 0;	
	err = res.getFieldInt( HttpFieldMap::kFieldContentLength, length );
	if ( err == kNoError )
	{
		const char *buffer;
		int buffer_len;
		
		while ( length > 0 )
		{
			buffer = (const char *)mBuffer.getBytes( 0, buffer_len );
			
			if ( buffer_len > length )
				buffer_len = length;
			
			if ( handler != NULL )
				handler->handleData( buffer, buffer_len );
			
			mBuffer.read( NULL, buffer_len );
			length -= buffer_len;

			if (length)
			{
				ret = handler->handleSocket( mSock, length );	

				if (ret < 0)
					return kReadFailed;
				length = 0;
			}
		}
	}
	else
	{
		const char *encoding = res.getField( HttpFieldMap::kFieldTransferEncoding );

		if ( encoding != NULL && strcmp( encoding, "chunked" ) == 0 )
		{			
			while ((read_len = parseChunkLine( mBuffer, length )) <= 0)
			{
				ret = mBuffer.fillFromFile( &mSock, mBuffer.getFreeSpace() );

				if (ret < 0)
				{
					LOG_ERR("Socket read failed...");
					return kReadFailed;
				}	

				if ( mBuffer.byteAt( 0 ) == '\r' )
					mBuffer.read( NULL, 1 );
				if ( mBuffer.byteAt( 0 ) == '\n' )
					mBuffer.read( NULL, 1 );
				
			}

			mBuffer.read( NULL, read_len );
			
			while ( length > 0 )
			{
				const char *buffer;
				int buffer_len;
			
				while ( length > 0 )
				{
					buffer = (const char *)mBuffer.getBytes( 0, buffer_len );
					
					if ( buffer_len > length )
						buffer_len = length;

					if ( (handler != NULL ) && (buffer_len) )
					{
						handler->handleData( buffer, buffer_len );
					
						mBuffer.read( NULL, buffer_len );
						length -= buffer_len;
					}

					if (length)
					{
						ret = handler->handleSocket( mSock, length );	

						if (ret <= 0)
						{
							if (ret == 0)
								return kNoError;
							else
								return kReadFailed;
						}
						length = 0;
					}

				}

				ret = mBuffer.fillFromFile( &mSock, mBuffer.getFreeSpace() );

				if (ret < 0)
				{
					LOG_ERR("Socket read failed...");
					return kReadFailed;
				}

				if ( mBuffer.byteAt( 0 ) == '\r' )
					mBuffer.read( NULL, 1 );
				if ( mBuffer.byteAt( 0 ) == '\n' )
					mBuffer.read( NULL, 1 );

				while ((read_len = parseChunkLine( mBuffer, length )) <= 0)
				{
					ret = mBuffer.fillFromFile( &mSock, mBuffer.getFreeSpace() );
					if (ret < 0)
					{
						LOG_ERR("Socket read failed...");
						return kReadFailed;
					}

					if ( mBuffer.byteAt( 0 ) == '\r' )
						mBuffer.read( NULL, 1 );
					if ( mBuffer.byteAt( 0 ) == '\n' )
						mBuffer.read( NULL, 1 );
				}

				mBuffer.read( NULL, read_len );
			}
			
			err = kNoError;
		}
	}

	if ( handler != NULL )
		handler->setStop(true);

	if ( !(( ret == 200 ) || ( ret == 206)) )
	{
		LOG_NOTICE("File not found... response code = %d", ret);
		return kNotFound;
	}

	return err;
}